

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_table_set_globalz(size_t len,secp256k1_ge *a,secp256k1_fe *zr)

{
  long lVar1;
  long lVar2;
  secp256k1_fe *b;
  secp256k1_ge *r;
  secp256k1_gej tmpa;
  secp256k1_fe zs;
  secp256k1_gej local_d8;
  secp256k1_fe local_58;
  
  lVar2 = len - 1;
  if (len != 0) {
    secp256k1_fe_normalize_weak(&a[lVar2].y);
    local_58.n[4] = zr[lVar2].n[4];
    local_58.n[0] = zr[lVar2].n[0];
    local_58.n[1] = zr[lVar2].n[1];
    local_58.n[2] = zr[lVar2].n[2];
    local_58.n[3] = (zr[lVar2].n + 2)[1];
    b = zr + len;
    r = a + (len - 2);
    for (lVar1 = 0; b = b + -1, lVar2 != lVar1; lVar1 = lVar1 + 1) {
      if (lVar1 != 0) {
        secp256k1_fe_mul(&local_58,&local_58,b);
      }
      local_d8.x.n[4] = (r->x).n[4];
      local_d8.x.n[0] = (r->x).n[0];
      local_d8.x.n[1] = (r->x).n[1];
      local_d8.x.n[2] = (r->x).n[2];
      local_d8.x.n[3] = (r->x).n[3];
      local_d8.y.n[4] = (r->y).n[4];
      local_d8.y.n[0] = (r->y).n[0];
      local_d8.y.n[1] = (r->y).n[1];
      local_d8.y.n[2] = (r->y).n[2];
      local_d8.y.n[3] = (r->y).n[3];
      local_d8.infinity = 0;
      secp256k1_ge_set_gej_zinv(r,&local_d8,&local_58);
      r = r + -1;
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_table_set_globalz(size_t len, secp256k1_ge *a, const secp256k1_fe *zr) {
    size_t i = len - 1;
    secp256k1_fe zs;

    if (len > 0) {
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&a[i].y);
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            secp256k1_gej tmpa;
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            tmpa.x = a[i].x;
            tmpa.y = a[i].y;
            tmpa.infinity = 0;
            secp256k1_ge_set_gej_zinv(&a[i], &tmpa, &zs);
        }
    }
}